

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# latexOutline.cpp
# Opt level: O3

optional<OutlineCommandData> *
getArgumentToCommand
          (optional<OutlineCommandData> *__return_storage_ptr__,TSNode commandNode,File *file,
          bool hasStar)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Point *pPVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  char16_t cVar4;
  TSNode self;
  TSNode self_00;
  TSNode self_01;
  TSNode self_02;
  TSNode self_03;
  TSNode node_00;
  TSNode self_04;
  TSNode self_05;
  TSNode self_06;
  Point PVar5;
  long lVar6;
  _Bool _Var7;
  int iVar8;
  char *pcVar9;
  TSPoint TVar10;
  Point PVar11;
  uint uVar12;
  ulong uVar13;
  uint uVar14;
  ulong uVar15;
  bool bVar16;
  TSNode node;
  string text;
  u16string text_1;
  undefined1 uVar17;
  undefined8 in_stack_fffffffffffffec0;
  undefined8 uVar18;
  codecvt_utf8_utf16<char16_t,_1114111UL,_(std::codecvt_mode)0> *in_stack_fffffffffffffec8;
  pointer in_stack_fffffffffffffed0;
  TSTree *in_stack_fffffffffffffed8;
  TSTree *pTStack_120;
  undefined1 local_108 [40];
  _Alloc_hider local_e0;
  size_type sStack_d8;
  anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
  local_d0;
  state_type local_c0;
  size_t sStack_b8;
  ulong local_b0;
  string local_a8;
  uint local_88;
  uint uStack_84;
  byte local_80;
  File *local_78;
  u16string local_70;
  u16string local_50;
  
  self_05.context._8_8_ = in_stack_fffffffffffffec8;
  self_05.context._0_8_ = in_stack_fffffffffffffec0;
  self_05.id = in_stack_fffffffffffffed0;
  self_05.tree = in_stack_fffffffffffffed8;
  local_78 = file;
  ts_node_next_named_sibling(self_05);
  self.context._8_8_ = in_stack_fffffffffffffed0;
  self.context._0_8_ = in_stack_fffffffffffffec8;
  self.id = in_stack_fffffffffffffed8;
  self.tree = pTStack_120;
  _Var7 = ts_node_is_null(self);
  if (!_Var7) {
    paVar1 = &(__return_storage_ptr__->super__Optional_base<OutlineCommandData,_false,_false>).
              _M_payload.super__Optional_payload<OutlineCommandData,_true,_false,_false>.
              super__Optional_payload_base<OutlineCommandData>._M_payload._M_value.name.field_2;
    pPVar2 = &(__return_storage_ptr__->super__Optional_base<OutlineCommandData,_false,_false>).
              _M_payload.super__Optional_payload<OutlineCommandData,_true,_false,_false>.
              super__Optional_payload_base<OutlineCommandData>._M_payload._M_value.endPoint;
    bVar16 = true;
    uVar18 = 0;
    do {
      self_00.context._8_8_ = in_stack_fffffffffffffed0;
      self_00.context._0_8_ = in_stack_fffffffffffffec8;
      self_00.id = in_stack_fffffffffffffed8;
      self_00.tree = pTStack_120;
      pcVar9 = ts_node_type(self_00);
      iVar8 = strcmp(pcVar9,"group");
      if (iVar8 == 0) {
        node_00.context._8_8_ = in_stack_fffffffffffffed0;
        node_00.context._0_8_ = in_stack_fffffffffffffec8;
        node_00.id = in_stack_fffffffffffffed8;
        node_00.tree = pTStack_120;
        getGroupText_abi_cxx11_(&local_a8,node_00,local_78);
        uVar17 = (undefined1)uVar18;
        lVar6 = (long)local_108 + 0x10;
        local_108._0_8_ = lVar6;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_108,local_a8._M_dataplus._M_p,
                   local_a8._M_dataplus._M_p + local_a8._M_string_length);
        self_04.context._8_8_ = in_stack_fffffffffffffed0;
        self_04.context._0_8_ = in_stack_fffffffffffffec8;
        self_04.id = in_stack_fffffffffffffed8;
        self_04.tree = pTStack_120;
        TVar10 = ts_node_end_point(self_04);
        local_108._32_8_ = fromTSPoint(TVar10);
        local_e0._M_p = (pointer)(CONCAT71(local_e0._M_p._1_7_,uVar17) & 0xffffffffffffff01);
        *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          **)&(__return_storage_ptr__->super__Optional_base<OutlineCommandData,_false,_false>).
              _M_payload.super__Optional_payload<OutlineCommandData,_true,_false,_false>.
              super__Optional_payload_base<OutlineCommandData>._M_payload = paVar1;
        if (local_108._0_8_ == lVar6) {
          paVar1->_M_allocated_capacity = local_108._16_8_;
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->super__Optional_base<OutlineCommandData,_false,_false>).
                   _M_payload.super__Optional_payload<OutlineCommandData,_true,_false,_false>.
                   super__Optional_payload_base<OutlineCommandData>._M_payload._M_value.name.field_2
           + 8) = local_108._24_8_;
        }
        else {
          (__return_storage_ptr__->super__Optional_base<OutlineCommandData,_false,_false>).
          _M_payload.super__Optional_payload<OutlineCommandData,_true,_false,_false>.
          super__Optional_payload_base<OutlineCommandData>._M_payload._M_value.name._M_dataplus =
               (_Alloc_hider)local_108._0_8_;
          (__return_storage_ptr__->super__Optional_base<OutlineCommandData,_false,_false>).
          _M_payload.super__Optional_payload<OutlineCommandData,_true,_false,_false>.
          super__Optional_payload_base<OutlineCommandData>._M_payload._M_value.name.field_2.
          _M_allocated_capacity = local_108._16_8_;
        }
        (__return_storage_ptr__->super__Optional_base<OutlineCommandData,_false,_false>)._M_payload.
        super__Optional_payload<OutlineCommandData,_true,_false,_false>.
        super__Optional_payload_base<OutlineCommandData>._M_payload._M_value.name._M_string_length =
             local_108._8_8_;
        local_108._8_8_ = (pointer)0x0;
        local_108._16_8_ = local_108._16_8_ & 0xffffffffffffff00;
        (__return_storage_ptr__->super__Optional_base<OutlineCommandData,_false,_false>)._M_payload.
        super__Optional_payload<OutlineCommandData,_true,_false,_false>.
        super__Optional_payload_base<OutlineCommandData>._M_payload._M_value.sawStar =
             local_e0._M_p._0_1_;
        *pPVar2 = (Point)local_108._32_8_;
        (__return_storage_ptr__->super__Optional_base<OutlineCommandData,_false,_false>)._M_payload.
        super__Optional_payload<OutlineCommandData,_true,_false,_false>.
        super__Optional_payload_base<OutlineCommandData>._M_engaged = true;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p == &local_a8.field_2) {
          return __return_storage_ptr__;
        }
        local_108._0_8_ = lVar6;
        operator_delete(local_a8._M_dataplus._M_p,
                        CONCAT71(local_a8.field_2._M_allocated_capacity._1_7_,
                                 local_a8.field_2._M_local_buf[0]) + 1);
        return __return_storage_ptr__;
      }
      self_01.context._8_8_ = in_stack_fffffffffffffed0;
      self_01.context._0_8_ = in_stack_fffffffffffffec8;
      self_01.id = in_stack_fffffffffffffed8;
      self_01.tree = pTStack_120;
      pcVar9 = ts_node_type(self_01);
      iVar8 = strcmp(pcVar9,"text");
      if (iVar8 == 0) {
        self_02.context._8_8_ = in_stack_fffffffffffffed0;
        self_02.context._0_8_ = in_stack_fffffffffffffec8;
        self_02.id = in_stack_fffffffffffffed8;
        self_02.tree = pTStack_120;
        TVar10 = ts_node_start_point(self_02);
        PVar11 = fromTSPoint(TVar10);
        File::textForNode_abi_cxx11_(&local_50,local_78,(TSNode *)&stack0xfffffffffffffec8);
        uVar13 = 0;
        if (local_50._M_string_length != 0) {
          uVar15 = (ulong)PVar11 >> 0x20;
          do {
            cVar4 = local_50._M_dataplus._M_p[uVar13];
            uVar14 = (int)uVar15 + 1;
            uVar15 = (ulong)uVar14;
            uVar12 = PVar11.row;
            if ((ushort)cVar4 < 0x20) {
              if (cVar4 != L'\t') {
                if (cVar4 != L'\n') {
LAB_0019883a:
                  local_c0.__count = 0;
                  local_c0.__value = (anon_union_4_2_91654ee9_for___value)0x0;
                  sStack_b8 = 0;
                  local_d0._M_allocated_capacity = 0;
                  local_d0._8_8_ = 0;
                  local_e0._M_p = (pointer)0x0;
                  sStack_d8 = 0;
                  local_108._24_8_ = 0;
                  local_108._32_4_ = 0;
                  local_108._36_4_ = 0;
                  local_b0 = 0;
                  local_108._0_8_ = operator_new(0x20);
                  *(undefined4 *)(local_108._0_8_ + 8) = 0;
                  *(undefined8 *)(local_108._0_8_ + 0x10) = 0x10ffff;
                  *(undefined4 *)(local_108._0_8_ + 0x18) = 0;
                  *(undefined ***)local_108._0_8_ = &PTR____codecvt_utf8_utf16_base_00216b88;
                  local_108._16_8_ = (TSTree *)0x0;
                  local_108._24_8_ = local_108._24_8_ & 0xffffffffffffff00;
                  local_e0._M_p = (pointer)((long)local_108 + 0x38);
                  sStack_d8 = 0;
                  local_d0._M_allocated_capacity =
                       local_d0._M_allocated_capacity & 0xffffffffffff0000;
                  local_b0 = local_b0 & 0xffffffffffff0000;
                  local_c0.__count = 0;
                  local_c0.__value = (anon_union_4_2_91654ee9_for___value)0x0;
                  sStack_b8 = 0;
                  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
                  local_70._M_string_length = 1;
                  local_70.field_2._M_local_buf[1] = L'\0';
                  local_108._8_8_ = (long)local_108 + 0x18;
                  local_70.field_2._M_local_buf[0] = cVar4;
                  UtfHandler::utf16to8(&local_a8,(UtfHandler *)local_108,&local_70);
                  local_80 = (byte)uVar18 & 1;
                  *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    **)&(__return_storage_ptr__->
                        super__Optional_base<OutlineCommandData,_false,_false>)._M_payload.
                        super__Optional_payload<OutlineCommandData,_true,_false,_false>.
                        super__Optional_payload_base<OutlineCommandData>._M_payload = paVar1;
                  paVar3 = &local_a8.field_2;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_a8._M_dataplus._M_p == paVar3) {
                    paVar1->_M_allocated_capacity =
                         CONCAT71(local_a8.field_2._M_allocated_capacity._1_7_,
                                  local_a8.field_2._M_local_buf[0]);
                    *(undefined8 *)
                     ((long)&(__return_storage_ptr__->
                             super__Optional_base<OutlineCommandData,_false,_false>)._M_payload.
                             super__Optional_payload<OutlineCommandData,_true,_false,_false>.
                             super__Optional_payload_base<OutlineCommandData>._M_payload._M_value.
                             name.field_2 + 8) = local_a8.field_2._8_8_;
                  }
                  else {
                    (__return_storage_ptr__->super__Optional_base<OutlineCommandData,_false,_false>)
                    ._M_payload.super__Optional_payload<OutlineCommandData,_true,_false,_false>.
                    super__Optional_payload_base<OutlineCommandData>._M_payload._M_value.name.
                    _M_dataplus = (_Alloc_hider)local_a8._M_dataplus._M_p;
                    (__return_storage_ptr__->super__Optional_base<OutlineCommandData,_false,_false>)
                    ._M_payload.super__Optional_payload<OutlineCommandData,_true,_false,_false>.
                    super__Optional_payload_base<OutlineCommandData>._M_payload._M_value.name.
                    field_2._M_allocated_capacity =
                         CONCAT71(local_a8.field_2._M_allocated_capacity._1_7_,
                                  local_a8.field_2._M_local_buf[0]);
                  }
                  (__return_storage_ptr__->super__Optional_base<OutlineCommandData,_false,_false>).
                  _M_payload.super__Optional_payload<OutlineCommandData,_true,_false,_false>.
                  super__Optional_payload_base<OutlineCommandData>._M_payload._M_value.name.
                  _M_string_length = local_a8._M_string_length;
                  local_a8._M_string_length = 0;
                  local_a8.field_2._M_local_buf[0] = '\0';
                  (__return_storage_ptr__->super__Optional_base<OutlineCommandData,_false,_false>).
                  _M_payload.super__Optional_payload<OutlineCommandData,_true,_false,_false>.
                  super__Optional_payload_base<OutlineCommandData>._M_payload._M_value.sawStar =
                       (bool)local_80;
                  PVar5.column = uVar14;
                  PVar5.row = uVar12;
                  *pPVar2 = PVar5;
                  (__return_storage_ptr__->super__Optional_base<OutlineCommandData,_false,_false>).
                  _M_payload.super__Optional_payload<OutlineCommandData,_true,_false,_false>.
                  super__Optional_payload_base<OutlineCommandData>._M_engaged = true;
                  local_a8._M_dataplus._M_p = (pointer)paVar3;
                  local_88 = uVar12;
                  uStack_84 = uVar14;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
                       *)local_70._M_dataplus._M_p != &local_70.field_2) {
                    operator_delete(local_70._M_dataplus._M_p,
                                    CONCAT44(local_70.field_2._M_allocated_capacity._4_4_,
                                             CONCAT22(local_70.field_2._M_local_buf[1],
                                                      local_70.field_2._M_local_buf[0])) * 2 + 2);
                  }
                  std::__cxx11::
                  wstring_convert<std::codecvt_utf8_utf16<char16_t,_1114111UL,_(std::codecvt_mode)0>,_char16_t,_std::allocator<char16_t>,_std::allocator<char>_>
                  ::~wstring_convert((wstring_convert<std::codecvt_utf8_utf16<char16_t,_1114111UL,_(std::codecvt_mode)0>,_char16_t,_std::allocator<char16_t>,_std::allocator<char>_>
                                      *)local_108);
                  uVar13 = 1;
                  goto LAB_001987a7;
                }
                if (!bVar16) {
                  (__return_storage_ptr__->super__Optional_base<OutlineCommandData,_false,_false>).
                  _M_payload.super__Optional_payload<OutlineCommandData,_true,_false,_false>.
                  super__Optional_payload_base<OutlineCommandData>._M_engaged = false;
                  uVar13 = 1;
                  bVar16 = false;
                  goto LAB_001987a7;
                }
LAB_0019876d:
                PVar11.row = uVar12 + 1;
                PVar11.column = 0;
                uVar15 = 0;
                bVar16 = false;
              }
            }
            else if (cVar4 != L' ') {
              if (cVar4 != L'*') {
                if (cVar4 != L'%') goto LAB_0019883a;
                do {
                  if (local_50._M_string_length <= uVar13) break;
                  uVar13 = (ulong)((int)uVar13 + 1);
                } while (local_50._M_dataplus._M_p[uVar13] != L'\n');
                goto LAB_0019876d;
              }
              if ((hasStar & 1U) == 0) {
                lVar6 = (long)local_108 + 0x10;
                local_108._0_8_ = lVar6;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_108,"*","");
                local_108._36_4_ = uVar14;
                local_108._32_4_ = uVar12;
                local_e0._M_p =
                     (pointer)(CONCAT71(local_e0._M_p._1_7_,(char)uVar18) & 0xffffffffffffff01);
                *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  **)&(__return_storage_ptr__->
                      super__Optional_base<OutlineCommandData,_false,_false>)._M_payload.
                      super__Optional_payload<OutlineCommandData,_true,_false,_false>.
                      super__Optional_payload_base<OutlineCommandData>._M_payload = paVar1;
                if (local_108._0_8_ == lVar6) {
                  paVar1->_M_allocated_capacity = local_108._16_8_;
                  *(undefined8 *)
                   ((long)&(__return_storage_ptr__->
                           super__Optional_base<OutlineCommandData,_false,_false>)._M_payload.
                           super__Optional_payload<OutlineCommandData,_true,_false,_false>.
                           super__Optional_payload_base<OutlineCommandData>._M_payload._M_value.name
                           .field_2 + 8) = local_108._24_8_;
                }
                else {
                  (__return_storage_ptr__->super__Optional_base<OutlineCommandData,_false,_false>).
                  _M_payload.super__Optional_payload<OutlineCommandData,_true,_false,_false>.
                  super__Optional_payload_base<OutlineCommandData>._M_payload._M_value.name.
                  _M_dataplus = (_Alloc_hider)local_108._0_8_;
                  (__return_storage_ptr__->super__Optional_base<OutlineCommandData,_false,_false>).
                  _M_payload.super__Optional_payload<OutlineCommandData,_true,_false,_false>.
                  super__Optional_payload_base<OutlineCommandData>._M_payload._M_value.name.field_2.
                  _M_allocated_capacity = local_108._16_8_;
                }
                (__return_storage_ptr__->super__Optional_base<OutlineCommandData,_false,_false>).
                _M_payload.super__Optional_payload<OutlineCommandData,_true,_false,_false>.
                super__Optional_payload_base<OutlineCommandData>._M_payload._M_value.name.
                _M_string_length = local_108._8_8_;
                local_108._8_8_ = (pointer)0x0;
                local_108._16_8_ = local_108._16_8_ & 0xffffffffffffff00;
                (__return_storage_ptr__->super__Optional_base<OutlineCommandData,_false,_false>).
                _M_payload.super__Optional_payload<OutlineCommandData,_true,_false,_false>.
                super__Optional_payload_base<OutlineCommandData>._M_payload._M_value.sawStar =
                     local_e0._M_p._0_1_;
                *pPVar2 = (Point)local_108._32_8_;
                (__return_storage_ptr__->super__Optional_base<OutlineCommandData,_false,_false>).
                _M_payload.super__Optional_payload<OutlineCommandData,_true,_false,_false>.
                super__Optional_payload_base<OutlineCommandData>._M_engaged = true;
                uVar13 = 1;
                hasStar = false;
                local_108._0_8_ = lVar6;
                goto LAB_001987a7;
              }
              uVar18 = 1;
              hasStar = false;
            }
            uVar13 = (ulong)((int)uVar13 + 1);
          } while (uVar13 < local_50._M_string_length);
          uVar13 = 0;
        }
LAB_001987a7:
        if ((anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity * 2 + 2);
        }
        if ((char)uVar13 != '\0') {
          return __return_storage_ptr__;
        }
      }
      self_06.context._8_8_ = in_stack_fffffffffffffec8;
      self_06.context[0] = (int)uVar18;
      self_06.context[1] = (int)((ulong)uVar18 >> 0x20);
      self_06.id = in_stack_fffffffffffffed0;
      self_06.tree = in_stack_fffffffffffffed8;
      ts_node_next_named_sibling(self_06);
      pTStack_120 = (TSTree *)local_108._24_8_;
      self_03.context[2] = local_108._8_4_;
      self_03.context[3] = local_108._12_4_;
      self_03.context[0] = local_108._0_4_;
      self_03.context[1] = local_108._4_4_;
      self_03.id = (void *)local_108._16_8_;
      self_03.tree = (TSTree *)local_108._24_8_;
      in_stack_fffffffffffffec8 =
           (codecvt_utf8_utf16<char16_t,_1114111UL,_(std::codecvt_mode)0> *)local_108._0_8_;
      in_stack_fffffffffffffed0 = (pointer)local_108._8_8_;
      in_stack_fffffffffffffed8 = (TSTree *)local_108._16_8_;
      _Var7 = ts_node_is_null(self_03);
    } while (!_Var7);
  }
  (__return_storage_ptr__->super__Optional_base<OutlineCommandData,_false,_false>)._M_payload.
  super__Optional_payload<OutlineCommandData,_true,_false,_false>.
  super__Optional_payload_base<OutlineCommandData>._M_engaged = false;
  return __return_storage_ptr__;
}

Assistant:

std::optional<OutlineCommandData> getArgumentToCommand (TSNode commandNode, File &file, bool hasStar) {
    bool s_whitespace { true };
    bool sawStar { false };

    TSNode node = ts_node_next_named_sibling(commandNode);
    while (!ts_node_is_null(node)) {

        if (NODE_NAME_IS(node, "group")) {
            string text = getGroupText(node, file);

            return OutlineCommandData {
                text,
                fromTSPoint(ts_node_end_point(node)),
                sawStar
            };
        }

        if (NODE_NAME_IS(node, "text")) {
            Point point = fromTSPoint(ts_node_start_point(node));
            auto text = file.textForNode(node);
            auto len = text.size();

            for (unsigned int i = 0; i < len; i++) {
                auto c = text[i];
                point.column++; // points to column right of char

                if (c == ' ' || c == '\t') {
                    continue;
                } else if (c == '%') {
                    s_whitespace = false;
                    while (i < len) {
                        i++;
                        if (text[i] == '\n') { break; }
                    }
                    point.row++;
                    point.column = 0;
                } else if (c == '\n') {
                    if (!s_whitespace) {
                        return {};
                    }
                    point.row++;
                    point.column = 0;
                    s_whitespace = false;
                } else if (c == '*') {
                    if (hasStar) {
                        sawStar = true;
                        hasStar = false;
                    } else {
                        return OutlineCommandData{
                            "*",
                            point,
                            sawStar
                        };
                    }
                } else {
                    return OutlineCommandData {
                            UtfHandler().utf16to8(u16string { c }),
                            point,
                            sawStar
                    };
                }
            }
        }

        node = ts_node_next_named_sibling(node);
    }

    return {};
}